

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.cpp
# Opt level: O0

void vera::rect(float _x,float _y,float _w,float _h,Shader *_program)

{
  initializer_list<glm::vec<2,_float,_(glm::qualifier)0>_> __l;
  initializer_list<glm::vec<2,_float,_(glm::qualifier)0>_> __l_00;
  reference pvVar1;
  allocator<glm::vec<2,_float,_(glm::qualifier)0>_> local_e1;
  value_type local_e0;
  value_type local_d8;
  value_type local_d0;
  value_type local_c8;
  value_type local_c0;
  value_type local_b8;
  iterator local_b0;
  size_type local_a8;
  undefined1 local_a0 [8];
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  tris;
  allocator<glm::vec<2,_float,_(glm::qualifier)0>_> local_71;
  vec<2,_float,_(glm::qualifier)0> local_70;
  vec<2,_float,_(glm::qualifier)0> local_68;
  vec<2,_float,_(glm::qualifier)0> local_60;
  vec<2,_float,_(glm::qualifier)0> local_58;
  vec<2,_float,_(glm::qualifier)0> local_50;
  vec<2,_float,_(glm::qualifier)0> *local_48;
  size_type local_40;
  undefined1 local_38 [8];
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  coorners;
  Shader *_program_local;
  float _h_local;
  float _w_local;
  float _y_local;
  float _x_local;
  
  if (shapeHAlign == 2) {
    _w_local = -_w * 0.5 + _x;
  }
  else {
    _w_local = _x;
    if (shapeHAlign == 4) {
      _w_local = _x - _w;
    }
  }
  if (shapeVAlign == 0x10) {
    _h_local = -_h * 0.5 + _y;
  }
  else {
    _h_local = _y;
    if (shapeVAlign == 0x20) {
      _h_local = _y - _h;
    }
  }
  coorners.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)_program;
  glm::vec<2,_float,_(glm::qualifier)0>::vec(&local_70,_w_local,_h_local);
  glm::vec<2,_float,_(glm::qualifier)0>::vec(&local_68,_w_local + _w,_h_local);
  glm::vec<2,_float,_(glm::qualifier)0>::vec(&local_60,_w_local + _w,_h_local + _h);
  glm::vec<2,_float,_(glm::qualifier)0>::vec(&local_58,_w_local,_h_local + _h);
  glm::vec<2,_float,_(glm::qualifier)0>::vec(&local_50,_w_local,_h_local);
  local_40 = 5;
  local_48 = &local_70;
  std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>::allocator(&local_71);
  __l_00._M_len = local_40;
  __l_00._M_array = local_48;
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
            *)local_38,__l_00,&local_71);
  std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>::~allocator(&local_71);
  pvVar1 = std::
           vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
           ::operator[]((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                         *)local_38,0);
  local_e0 = *pvVar1;
  pvVar1 = std::
           vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
           ::operator[]((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                         *)local_38,1);
  local_d8 = *pvVar1;
  pvVar1 = std::
           vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
           ::operator[]((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                         *)local_38,2);
  local_d0 = *pvVar1;
  pvVar1 = std::
           vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
           ::operator[]((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                         *)local_38,2);
  local_c8 = *pvVar1;
  pvVar1 = std::
           vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
           ::operator[]((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                         *)local_38,3);
  local_c0 = *pvVar1;
  pvVar1 = std::
           vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
           ::operator[]((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                         *)local_38,0);
  local_b8 = *pvVar1;
  local_b0 = &local_e0;
  local_a8 = 6;
  std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>::allocator(&local_e1);
  __l._M_len = local_a8;
  __l._M_array = local_b0;
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
            *)local_a0,__l,&local_e1);
  std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>::~allocator(&local_e1);
  if (coorners.
      super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
    if ((fill_enabled & 1) != 0) {
      triangles((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                 *)local_a0,(Shader *)0x0);
    }
    if ((stroke_enabled & 1) != 0) {
      line((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
            *)local_38,(Shader *)0x0);
    }
  }
  else {
    triangles((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
               *)local_a0,
              (Shader *)
              coorners.
              super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
             *)local_a0);
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
             *)local_38);
  return;
}

Assistant:

void rect(float _x, float _y, float _w, float _h, Shader* _program) {
    if (shapeHAlign == ALIGN_CENTER)
        _x -= _w * 0.5f;
    else if (shapeHAlign == ALIGN_RIGHT)
        _x -= _w;
    
    if (shapeVAlign == ALIGN_MIDDLE)
        _y -= _h * 0.5f;
    else if (shapeVAlign == ALIGN_BOTTOM)
        _y -= _h;

    std::vector<glm::vec2> coorners = { glm::vec2(_x, _y),     glm::vec2(_x + _w, _y), 
                                        glm::vec2(_x + _w, _y + _h), glm::vec2(_x, _y + _h),
                                        glm::vec2(_x, _y) };

    std::vector<glm::vec2> tris = {     coorners[0], coorners[1], coorners[2],
                                        coorners[2], coorners[3], coorners[0] };

    if (_program == nullptr) {
        if (fill_enabled) triangles(tris);
        if (stroke_enabled) line(coorners);
    }
    else
        triangles(tris, _program);
}